

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

int __thiscall
OSSLRSA::sign(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong extraout_RAX;
  size_t sVar6;
  size_t sVar7;
  ulong extraout_RAX_00;
  RSA *pRVar8;
  ulong extraout_RAX_01;
  uchar *puVar9;
  uchar *puVar10;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar11;
  undefined8 uVar12;
  ulong extraout_RAX_07;
  ulong extraout_RAX_08;
  ulong extraout_RAX_09;
  ulong extraout_RAX_10;
  ulong extraout_RAX_11;
  ulong extraout_RAX_12;
  ulong extraout_RAX_13;
  long in_stack_00000008;
  int sigLen_2;
  RSA *rsa_2;
  OSSLRSAPrivateKey *osslKey_2;
  int sigLen_1;
  int status;
  ByteString em;
  size_t sParamLen;
  RSA *rsa_1;
  OSSLRSAPrivateKey *osslKey_1;
  EVP_MD *hash;
  size_t allowedLen_1;
  RSA_PKCS_PSS_PARAMS *pssParam;
  int sigLen;
  RSA *rsa;
  size_t allowedLen;
  OSSLRSAPrivateKey *osslKey;
  ByteString *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  EVP_MD *local_70;
  size_t local_68;
  undefined1 local_1;
  
  iVar1 = (int)tbs;
  if (iVar1 == 3) {
    uVar5 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
    if ((uVar5 & 1) == 0) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4f,"Invalid key type supplied");
      local_1 = 0;
      uVar5 = extraout_RAX;
    }
    else {
      (**(code **)(*(long *)ctx + 0xb0))();
      sVar6 = ByteString::size((ByteString *)0x1bce35);
      sVar7 = ByteString::size((ByteString *)0x1bce4e);
      if (sVar6 - 0xb < sVar7) {
        softHSMLog(3,"sign",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x5c,"Data to sign exceeds maximum for PKCS #1 signature");
        local_1 = 0;
        uVar5 = extraout_RAX_00;
      }
      else {
        (**(code **)(*(long *)ctx + 0xb0))();
        ByteString::size((ByteString *)0x1bceb4);
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (size_t)in_stack_fffffffffffffe48);
        pRVar8 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                  ((OSSLRSAPrivateKey *)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        iVar1 = RSA_blinding_on(pRVar8,(BN_CTX *)0x0);
        if (iVar1 == 0) {
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x68,"Failed to turn on blinding for OpenSSL RSA key");
          local_1 = 0;
          uVar5 = extraout_RAX_01;
        }
        else {
          sVar6 = ByteString::size((ByteString *)0x1bcf2f);
          puVar9 = ByteString::const_byte_str(in_stack_fffffffffffffe48);
          puVar10 = ByteString::operator[]
                              ((ByteString *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               (size_t)in_stack_fffffffffffffe48);
          iVar1 = RSA_private_encrypt((int)sVar6,puVar9,puVar10,pRVar8,1);
          RSA_blinding_off(pRVar8);
          if (iVar1 == -1) {
            softHSMLog(3,"sign",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x73,"An error occurred while performing a PKCS #1 signature");
            local_1 = 0;
            uVar5 = extraout_RAX_02;
          }
          else {
            ByteString::resize((ByteString *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               (size_t)in_stack_fffffffffffffe48);
            local_1 = 1;
            uVar5 = extraout_RAX_03;
          }
        }
      }
    }
  }
  else if (iVar1 == 10) {
    uVar5 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
    if ((uVar5 & 1) == 0) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x85,"Invalid key type supplied");
      local_1 = 0;
      uVar5 = extraout_RAX_04;
    }
    else if ((tbslen == 0) || (in_stack_00000008 != 0x10)) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x8c,"Invalid parameters supplied");
      local_1 = 0;
      uVar5 = extraout_RAX_05;
    }
    else {
      uVar2 = *(int *)tbslen - 2;
      uVar3 = *(int *)tbslen - 6;
      uVar5 = (ulong)uVar3;
      if (uVar2 < 4 || uVar3 == 0) {
        switch((long)&switchD_001bd0ec::switchdataD_001f5110 +
               (long)(int)(&switchD_001bd0ec::switchdataD_001f5110)[uVar2]) {
        case 0x1bd0ee:
          local_70 = EVP_sha1();
          local_68 = 0x14;
          break;
        case 0x1bd109:
          local_70 = EVP_sha224();
          local_68 = 0x1c;
          break;
        case 0x1bd124:
          local_70 = EVP_sha256();
          local_68 = 0x20;
          break;
        case 0x1bd13f:
          local_70 = EVP_sha384();
          local_68 = 0x30;
          break;
        case 0x1bd15a:
          local_70 = EVP_sha512();
          local_68 = 0x40;
        }
        pRVar8 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                  ((OSSLRSAPrivateKey *)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        sVar6 = ByteString::size((ByteString *)0x1bd1b4);
        if (sVar6 == local_68) {
          uVar5 = *(ulong *)(tbslen + 8);
          lVar11 = (**(code **)(*(long *)ctx + 0x20))();
          if (((lVar11 + 6U >> 3) - 2) - local_68 < uVar5) {
            uVar12 = (**(code **)(*(long *)ctx + 0x20))();
            softHSMLog(3,"sign",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0xbd,"sLen (%lu) is too large for current key size (%lu)",uVar5,uVar12);
            local_1 = 0;
            uVar5 = extraout_RAX_07;
          }
          else {
            ByteString::ByteString((ByteString *)0x1bd2bc);
            (**(code **)(*(long *)ctx + 0xb0))();
            ByteString::size((ByteString *)0x1bd2e7);
            ByteString::resize((ByteString *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               (size_t)in_stack_fffffffffffffe48);
            puVar9 = ByteString::operator[]
                               ((ByteString *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                (size_t)in_stack_fffffffffffffe48);
            puVar10 = ByteString::const_byte_str(in_stack_fffffffffffffe48);
            iVar1 = RSA_padding_add_PKCS1_PSS_mgf1
                              (pRVar8,puVar9,puVar10,local_70,local_70,*(int *)(tbslen + 8));
            if (iVar1 == 0) {
              softHSMLog(3,"sign",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                         ,199,"Error in RSA PSS padding generation");
              local_1 = 0;
            }
            else {
              iVar1 = RSA_blinding_on(pRVar8,(BN_CTX *)0x0);
              if (iVar1 == 0) {
                softHSMLog(3,"sign",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                           ,0xcf,"Failed to turn on blinding for OpenSSL RSA key");
                local_1 = 0;
              }
              else {
                (**(code **)(*(long *)ctx + 0xb0))();
                ByteString::size((ByteString *)0x1bd48b);
                ByteString::resize((ByteString *)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                   (size_t)in_stack_fffffffffffffe48);
                (**(code **)(*(long *)ctx + 0xb0))();
                sVar6 = ByteString::size((ByteString *)0x1bd4c8);
                puVar9 = ByteString::operator[]
                                   ((ByteString *)
                                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                    (size_t)in_stack_fffffffffffffe48);
                puVar10 = ByteString::operator[]
                                    ((ByteString *)
                                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                     (size_t)in_stack_fffffffffffffe48);
                iVar1 = RSA_private_encrypt((int)sVar6,puVar9,puVar10,pRVar8,3);
                RSA_blinding_off(pRVar8);
                if (iVar1 == -1) {
                  softHSMLog(3,"sign",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                             ,0xdd,"An error occurred while performing the RSA-PSS signature");
                  local_1 = 0;
                }
                else {
                  ByteString::resize((ByteString *)
                                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                     (size_t)in_stack_fffffffffffffe48);
                  local_1 = 1;
                }
              }
            }
            ByteString::~ByteString((ByteString *)0x1bd5c7);
            uVar5 = extraout_RAX_08;
          }
        }
        else {
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0xb4,"Data to sign does not match expected (%d) for RSA PSS",local_68);
          local_1 = 0;
          uVar5 = extraout_RAX_06;
        }
      }
      else {
        local_1 = 0;
      }
    }
  }
  else if (iVar1 == 1) {
    uVar5 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
    if ((uVar5 & 1) == 0) {
      softHSMLog(3,"sign",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0xed,"Invalid key type supplied");
      local_1 = 0;
      uVar5 = extraout_RAX_09;
    }
    else {
      sVar6 = ByteString::size((ByteString *)0x1bd646);
      (**(code **)(*(long *)ctx + 0xb0))();
      sVar7 = ByteString::size((ByteString *)0x1bd664);
      if (sVar6 == sVar7) {
        (**(code **)(*(long *)ctx + 0xb0))();
        ByteString::size((ByteString *)0x1bd6ca);
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (size_t)in_stack_fffffffffffffe48);
        pRVar8 = (RSA *)OSSLRSAPrivateKey::getOSSLKey
                                  ((OSSLRSAPrivateKey *)
                                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        iVar1 = RSA_blinding_on(pRVar8,(BN_CTX *)0x0);
        if (iVar1 == 0) {
          softHSMLog(3,"sign",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x103,"Failed to turn on blinding for OpenSSL RSA key");
          local_1 = 0;
          uVar5 = extraout_RAX_11;
        }
        else {
          sVar6 = ByteString::size((ByteString *)0x1bd742);
          iVar1 = (int)sVar6;
          puVar9 = ByteString::const_byte_str(in_stack_fffffffffffffe48);
          puVar10 = ByteString::operator[]
                              ((ByteString *)CONCAT44(iVar1,in_stack_fffffffffffffe50),
                               (size_t)in_stack_fffffffffffffe48);
          iVar4 = RSA_private_encrypt(iVar1,puVar9,puVar10,pRVar8,3);
          RSA_blinding_off(pRVar8);
          if (iVar4 == -1) {
            softHSMLog(3,"sign",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x10e,"An error occurred while performing a raw RSA signature");
            local_1 = 0;
            uVar5 = extraout_RAX_12;
          }
          else {
            ByteString::resize((ByteString *)CONCAT44(iVar1,in_stack_fffffffffffffe50),
                               (size_t)in_stack_fffffffffffffe48);
            local_1 = 1;
            uVar5 = extraout_RAX_13;
          }
        }
      }
      else {
        softHSMLog(3,"sign",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0xf7,"Size of data to sign does not match the modulus size");
        local_1 = 0;
        uVar5 = extraout_RAX_10;
      }
    }
  }
  else {
    uVar2 = AsymmetricAlgorithm::sign
                      (&this->super_AsymmetricAlgorithm,ctx,sig,siglen,
                       (uchar *)((ulong)tbs & 0xffffffff),tbslen);
    uVar5 = (ulong)uVar2 & 0xffffffffffffff01;
    local_1 = (undefined1)uVar5;
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),local_1);
}

Assistant:

bool OSSLRSA::sign(PrivateKey* privateKey, const ByteString& dataToSign,
		   ByteString& signature, const AsymMech::Type mechanism,
		   const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (mechanism == AsymMech::RSA_PKCS)
	{
		// Separate implementation for RSA PKCS #1 signing without hash computation

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// In case of PKCS #1 signing the length of the input data may not exceed 40% of the
		// modulus size
		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		size_t allowedLen = osslKey->getN().size() - 11;

		if (dataToSign.size() > allowedLen)
		{
			ERROR_MSG("Data to sign exceeds maximum for PKCS #1 signature");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		int sigLen = RSA_private_encrypt(dataToSign.size(), (unsigned char*) dataToSign.const_byte_str(), &signature[0], rsa, RSA_PKCS1_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing a PKCS #1 signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else if (mechanism == AsymMech::RSA_PKCS_PSS)
	{
		const RSA_PKCS_PSS_PARAMS *pssParam = (RSA_PKCS_PSS_PARAMS*)param;

		// Separate implementation for RSA PKCS #1 signing without hash computation

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		if (pssParam == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS))
		{
			ERROR_MSG("Invalid parameters supplied");

			return false;
		}

		size_t allowedLen;
		const EVP_MD* hash = NULL;

		switch (pssParam->hashAlg)
		{
		case HashAlgo::SHA1:
			hash = EVP_sha1();
			allowedLen = 20;
			break;
		case HashAlgo::SHA224:
			hash = EVP_sha224();
			allowedLen = 28;
			break;
		case HashAlgo::SHA256:
			hash = EVP_sha256();
			allowedLen = 32;
			break;
		case HashAlgo::SHA384:
			hash = EVP_sha384();
			allowedLen = 48;
			break;
		case HashAlgo::SHA512:
			hash = EVP_sha512();
			allowedLen = 64;
			break;
		default:
			return false;
		}

		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		RSA* rsa = osslKey->getOSSLKey();

		if (dataToSign.size() != allowedLen)
		{
			ERROR_MSG("Data to sign does not match expected (%d) for RSA PSS", (int)allowedLen);

			return false;
		}

		size_t sParamLen = pssParam->sLen;
		if (sParamLen > ((privateKey->getBitLength()+6)/8-2-allowedLen))
		{
			ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
				  (unsigned long)sParamLen, privateKey->getBitLength());
			return false;
		}

		ByteString em;
		em.resize(osslKey->getN().size());

		int status = RSA_padding_add_PKCS1_PSS_mgf1(rsa, &em[0], (unsigned char*) dataToSign.const_byte_str(), hash, hash, pssParam->sLen);
		if (!status)
		{
			ERROR_MSG("Error in RSA PSS padding generation");

			return false;
		}


		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		int sigLen = RSA_private_encrypt(osslKey->getN().size(), &em[0], &signature[0], rsa, RSA_NO_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing the RSA-PSS signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else if (mechanism == AsymMech::RSA)
	{
		// Separate implementation for raw RSA signing

		// Check if the private key is the right type
		if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// In case of raw RSA, the length of the input data must match the length of the modulus
		OSSLRSAPrivateKey* osslKey = (OSSLRSAPrivateKey*) privateKey;

		if (dataToSign.size() != osslKey->getN().size())
		{
			ERROR_MSG("Size of data to sign does not match the modulus size");

			return false;
		}

		// Perform the signature operation
		signature.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		if (!RSA_blinding_on(rsa, NULL))
		{
			ERROR_MSG("Failed to turn on blinding for OpenSSL RSA key");

			return false;
		}

		int sigLen = RSA_private_encrypt(dataToSign.size(), (unsigned char*) dataToSign.const_byte_str(), &signature[0], rsa, RSA_NO_PADDING);

		RSA_blinding_off(rsa);

		if (sigLen == -1)
		{
			ERROR_MSG("An error occurred while performing a raw RSA signature");

			return false;
		}

		signature.resize(sigLen);

		return true;
	}
	else
	{
		// Call default implementation
		return AsymmetricAlgorithm::sign(privateKey, dataToSign, signature, mechanism, param, paramLen);
	}
}